

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeChangeToNoop(Vdbe *p,int addr)

{
  undefined1 *p4;
  int in_ESI;
  sqlite3 *in_RDI;
  bool bVar1;
  VdbeOp *pOp;
  uint local_4;
  
  bVar1 = *(char *)((long)&in_RDI->pVfs->xDlClose + 1) == '\0';
  if (bVar1) {
    p4 = (undefined1 *)(*(long *)&in_RDI->mTrace + (long)in_ESI * 0x18);
    freeP4(in_RDI,in_ESI,p4);
    p4[1] = 0;
    *(undefined8 *)(p4 + 0x10) = 0;
    *p4 = 0xab;
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeChangeToNoop(Vdbe *p, int addr){
  VdbeOp *pOp;
  if( p->db->mallocFailed ) return 0;
  assert( addr>=0 && addr<p->nOp );
  pOp = &p->aOp[addr];
  freeP4(p->db, pOp->p4type, pOp->p4.p);
  pOp->p4type = P4_NOTUSED;
  pOp->p4.z = 0;
  pOp->opcode = OP_Noop;
  return 1;
}